

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapimages.cpp
# Opt level: O0

void __thiscall CMapImages::LoadMapImages(CMapImages *this,IMap *pMap,CLayers *pLayers,int MapType)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  IGraphics *pIVar5;
  CMapItemLayer *pCVar6;
  int *piVar7;
  undefined8 uVar8;
  int in_ECX;
  CLayers *in_RDX;
  long *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  void *pData;
  char *pName;
  CMapItemImage *pImg;
  CMapItemLayer *pLayer;
  int k;
  bool FoundTileLayer;
  bool FoundQuadLayer;
  int TextureFlags;
  int i_1;
  int i;
  int Start;
  char Buf [512];
  int in_stack_fffffffffffffd5c;
  CMapImages *in_stack_fffffffffffffd60;
  uint local_294;
  CGameClient *in_stack_fffffffffffffd70;
  int local_248;
  uint local_240;
  int local_23c;
  int local_238;
  int local_20c;
  char local_208 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((-1 < in_ECX) && (in_ECX < 2)) {
    for (local_238 = 0; local_238 < *(int *)(in_RDI + (long)in_ECX * 0x104 + 0x110);
        local_238 = local_238 + 1) {
      pIVar5 = CComponent::Graphics((CComponent *)0x16e70b);
      (*(pIVar5->super_IInterface)._vptr_IInterface[0xf])
                (pIVar5,in_RDI + 0x10 + (long)in_ECX * 0x104 + (long)local_238 * 4);
    }
    *(undefined4 *)(in_RDI + (long)in_ECX * 0x104 + 0x110) = 0;
    (**(code **)(*in_RSI + 0x30))(in_RSI,2,&local_20c,in_RDI + (long)in_ECX * 0x104 + 0x110);
    iVar4 = clamp<int>(*(int *)(in_RDI + (long)in_ECX * 0x104 + 0x110),0,0x40);
    *(int *)(in_RDI + (long)in_ECX * 0x104 + 0x110) = iVar4;
    for (local_23c = 0; local_23c < *(int *)(in_RDI + (long)in_ECX * 0x104 + 0x110);
        local_23c = local_23c + 1) {
      local_240 = 0;
      bVar3 = false;
      bVar2 = false;
      for (local_248 = 0; iVar4 = CLayers::NumLayers(in_RDX), local_248 < iVar4;
          local_248 = local_248 + 1) {
        pCVar6 = CLayers::GetLayer((CLayers *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
        if (((!bVar3) && (pCVar6->m_Type == 3)) && (pCVar6[2].m_Version == local_23c)) {
          bVar3 = true;
        }
        if (((!bVar2) && (pCVar6->m_Type == 2)) && (pCVar6[4].m_Type == local_23c)) {
          bVar2 = true;
        }
      }
      if ((bVar2) && (local_240 = 4, bVar3)) {
        local_240 = 8;
      }
      piVar7 = (int *)(**(code **)(*in_RSI + 0x28))(in_RSI,local_20c + local_23c,0);
      if ((piVar7[3] == 0) && (((*piVar7 < 2 || (piVar7[6] == 0)) || (piVar7[6] == 1)))) {
        uVar8 = (**(code **)(*in_RSI + 0x10))(in_RSI,piVar7[5]);
        in_stack_fffffffffffffd70 = (CGameClient *)CComponent::Graphics((CComponent *)0x16e9f6);
        if (*piVar7 == 1) {
          local_294 = 1;
        }
        else {
          local_294 = piVar7[6];
        }
        iVar4 = (*(in_stack_fffffffffffffd70->super_IGameClient).super_IInterface._vptr_IInterface
                  [0x10])(in_stack_fffffffffffffd70,(ulong)(uint)piVar7[1],(ulong)(uint)piVar7[2],
                          (ulong)local_294,uVar8,1,local_240);
        *(int *)(in_RDI + 0x10 + (long)in_ECX * 0x104 + (long)local_23c * 4) = iVar4;
        (**(code **)(*in_RSI + 0x20))(in_RSI,piVar7[5]);
      }
      else {
        uVar8 = (**(code **)(*in_RSI + 0x10))(in_RSI,piVar7[4]);
        str_format(local_208,0x200,"mapres/%s.png",uVar8);
        pIVar5 = CComponent::Graphics((CComponent *)0x16e97c);
        iVar4 = (*(pIVar5->super_IInterface)._vptr_IInterface[0x12])
                          (pIVar5,local_208,0xffffffff,0xffffffff,(ulong)local_240);
        *(int *)(in_RDI + 0x10 + (long)in_ECX * 0x104 + (long)local_23c * 4) = iVar4;
      }
    }
    bVar3 = CGameClient::IsEaster(in_stack_fffffffffffffd70);
    if (bVar3) {
      GetEasterTexture(in_stack_fffffffffffffd60);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CMapImages::LoadMapImages(IMap *pMap, class CLayers *pLayers, int MapType)
{
	if(MapType < 0 || MapType >= NUM_MAP_TYPES)
		return;

	// unload all textures
	for(int i = 0; i < m_Info[MapType].m_Count; i++)
		Graphics()->UnloadTexture(&(m_Info[MapType].m_aTextures[i]));
	m_Info[MapType].m_Count = 0;

	int Start;
	pMap->GetType(MAPITEMTYPE_IMAGE, &Start, &m_Info[MapType].m_Count);
	m_Info[MapType].m_Count = clamp(m_Info[MapType].m_Count, 0, int(MAX_TEXTURES));

	// load new textures
	for(int i = 0; i < m_Info[MapType].m_Count; i++)
	{
		int TextureFlags = 0;
		bool FoundQuadLayer = false;
		bool FoundTileLayer = false;
		for(int k = 0; k < pLayers->NumLayers(); k++)
		{
			const CMapItemLayer * const pLayer = pLayers->GetLayer(k);
			if(!FoundQuadLayer && pLayer->m_Type == LAYERTYPE_QUADS && ((const CMapItemLayerQuads *)pLayer)->m_Image == i)
				FoundQuadLayer = true;
			if(!FoundTileLayer && pLayer->m_Type == LAYERTYPE_TILES && ((const CMapItemLayerTilemap *)pLayer)->m_Image == i)
				FoundTileLayer = true;
		}
		if(FoundTileLayer)
			TextureFlags = FoundQuadLayer ? IGraphics::TEXLOAD_MULTI_DIMENSION : IGraphics::TEXLOAD_ARRAY_256;

		CMapItemImage *pImg = (CMapItemImage *)pMap->GetItem(Start+i, 0, 0);
		if(pImg->m_External || (pImg->m_Version > 1 && pImg->m_Format != CImageInfo::FORMAT_RGB && pImg->m_Format != CImageInfo::FORMAT_RGBA))
		{
			char Buf[IO_MAX_PATH_LENGTH];
			char *pName = (char *)pMap->GetData(pImg->m_ImageName);
			str_format(Buf, sizeof(Buf), "mapres/%s.png", pName);
			m_Info[MapType].m_aTextures[i] = Graphics()->LoadTexture(Buf, IStorage::TYPE_ALL, CImageInfo::FORMAT_AUTO, TextureFlags);
		}
		else
		{
			void *pData = pMap->GetData(pImg->m_ImageData);
			m_Info[MapType].m_aTextures[i] = Graphics()->LoadTextureRaw(pImg->m_Width, pImg->m_Height, pImg->m_Version == 1 ? CImageInfo::FORMAT_RGBA : pImg->m_Format, pData, CImageInfo::FORMAT_RGBA, TextureFlags);
			pMap->UnloadData(pImg->m_ImageData);
		}
	}

	// easter time, preload easter tileset
	if(m_pClient->IsEaster())
		GetEasterTexture();
}